

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

size_t __thiscall efsw::String::find_first_of(String *this,char *s,size_t pos)

{
  ulong uVar1;
  size_t __i;
  size_type sVar2;
  ulong uVar3;
  String local_38;
  
  String(&local_38,s);
  uVar1 = (this->mString)._M_string_length;
  uVar3 = 0xffffffffffffffff;
  if (pos < uVar1 && local_38.mString._M_string_length != 0) {
    do {
      sVar2 = 0;
      do {
        uVar3 = pos;
        if (local_38.mString._M_dataplus._M_p[sVar2] == (this->mString)._M_dataplus._M_p[pos])
        goto LAB_00107f52;
        sVar2 = sVar2 + 1;
      } while (local_38.mString._M_string_length != sVar2);
      pos = pos + 1;
      uVar3 = 0xffffffffffffffff;
    } while (pos != uVar1);
  }
LAB_00107f52:
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_38.mString._M_dataplus._M_p != &local_38.mString.field_2) {
    operator_delete(local_38.mString._M_dataplus._M_p);
  }
  return uVar3;
}

Assistant:

std::size_t String::find_first_of( const char* s, std::size_t pos ) const {
	return find_first_of( String( s ), pos );
}